

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

istream * __thiscall nivalis::Plotter::import_binary_render_result(Plotter *this,istream *is)

{
  istream *piVar1;
  DrawBufferObject *pDVar2;
  size_type sVar3;
  long lVar4;
  istream *in_RSI;
  long in_RDI;
  bool loss_detail_tmp;
  string func_error_tmp;
  size_t i_1;
  size_t i;
  PointMarker *in_stack_ffffffffffffff68;
  istream *in_stack_ffffffffffffff70;
  istream *in_stack_ffffffffffffff98;
  ulong uVar5;
  DrawBufferObject *this_00;
  byte local_4d;
  string local_40 [32];
  ulong local_20;
  DrawBufferObject *local_18;
  istream *local_10;
  
  local_10 = in_RSI;
  util::
  resize_from_read_bin<std::vector<nivalis::DrawBufferObject,std::allocator<nivalis::DrawBufferObject>>>
            (in_stack_ffffffffffffff70,
             (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
             in_stack_ffffffffffffff68);
  local_18 = (DrawBufferObject *)0x0;
  while (this_00 = local_18,
        pDVar2 = (DrawBufferObject *)
                 std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                 ::size((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                         *)(in_RDI + 0x248)), this_00 < pDVar2) {
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::operator[]
              ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
               (in_RDI + 0x248),(size_type)local_18);
    DrawBufferObject::from_bin(this_00,in_stack_ffffffffffffff98);
    local_18 = (DrawBufferObject *)
               ((long)&(local_18->points).
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  util::resize_from_read_bin<std::vector<nivalis::PointMarker,std::allocator<nivalis::PointMarker>>>
            (in_stack_ffffffffffffff70,
             (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
             in_stack_ffffffffffffff68);
  local_20 = 0;
  while (uVar5 = local_20,
        sVar3 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::size
                          ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                           (in_RDI + 0x280)), uVar5 < sVar3) {
    std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::operator[]
              ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
               (in_RDI + 0x280),local_20);
    util::read_bin<nivalis::PointMarker>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::string(local_40);
  util::resize_from_read_bin<std::__cxx11::string>
            (in_stack_ffffffffffffff70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68);
  piVar1 = local_10;
  lVar4 = std::__cxx11::string::operator[]((ulong)local_40);
  std::__cxx11::string::size();
  std::istream::read((char *)piVar1,lVar4);
  util::read_bin<bool>(in_stack_ffffffffffffff70,(bool *)in_stack_ffffffffffffff68);
  if ((local_4d & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x2b0) & 1) != 0) {
      std::__cxx11::string::clear();
    }
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x58),local_40);
  }
  *(byte *)(in_RDI + 0x2b0) = local_4d & 1;
  *(undefined1 *)(in_RDI + 0xe1) = 1;
  std::__cxx11::string::~string(local_40);
  return local_10;
}

Assistant:

std::istream& Plotter::import_binary_render_result(std::istream& is) {
    util::resize_from_read_bin(is, draw_buf);
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        draw_buf[i].from_bin(is);
    }
    util::resize_from_read_bin(is, pt_markers);
    for (size_t i = 0; i < pt_markers.size(); ++i) {
        util::read_bin(is, pt_markers[i]);
    }
    std::string func_error_tmp;
    util::resize_from_read_bin(is, func_error_tmp);
    is.read(&func_error_tmp[0], func_error_tmp.size());
    bool loss_detail_tmp;
    util::read_bin(is, loss_detail_tmp);
    if (loss_detail_tmp) {
        func_error = func_error_tmp;
    } else if (loss_detail) {
        func_error.clear();
    }
    loss_detail = loss_detail_tmp;
    require_update = true;
    return is;
}